

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenType
TypeBuilderGetTempTupleType(TypeBuilderRef builder,BinaryenType *types,BinaryenIndex numTypes)

{
  reference pvVar1;
  TypeID TVar2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_78;
  Type local_60;
  Type local_58;
  uint local_50;
  BinaryenIndex cur;
  allocator<wasm::Type> local_39;
  undefined1 local_38 [8];
  TypeList typeList;
  BinaryenIndex numTypes_local;
  BinaryenType *types_local;
  TypeBuilderRef builder_local;
  
  typeList.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = numTypes;
  std::allocator<wasm::Type>::allocator(&local_39);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38,(ulong)numTypes,&local_39);
  std::allocator<wasm::Type>::~allocator(&local_39);
  for (local_50 = 0;
      local_50 <
      typeList.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_50 = local_50 + 1) {
    wasm::Type::Type(&local_58,types[local_50]);
    pvVar1 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                       ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38,(ulong)local_50)
    ;
    pvVar1->id = local_58.id;
  }
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            (&local_78,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
  local_60 = wasm::TypeBuilder::getTempTupleType(builder,&local_78);
  TVar2 = wasm::Type::getID(&local_60);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_78);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
  return TVar2;
}

Assistant:

BinaryenType TypeBuilderGetTempTupleType(TypeBuilderRef builder,
                                         BinaryenType* types,
                                         BinaryenIndex numTypes) {
  TypeList typeList(numTypes);
  for (BinaryenIndex cur = 0; cur < numTypes; ++cur) {
    typeList[cur] = Type(types[cur]);
  }
  return ((TypeBuilder*)builder)->getTempTupleType(Tuple(typeList)).getID();
}